

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

void __thiscall
llama_context::llama_context(llama_context *this,llama_model *model,llama_context_params params)

{
  value_type pgVar1;
  value_type pgVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int32_t iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  reference ppgVar15;
  ulong uVar16;
  runtime_error *prVar17;
  undefined8 uVar18;
  long lVar19;
  pointer pgVar20;
  undefined8 uVar21;
  pointer plVar22;
  const_reference ppgVar23;
  size_type sVar24;
  pointer pgVar25;
  ggml_backend **ppgVar26;
  ggml_backend_buffer_type **ppgVar27;
  pointer pgVar28;
  ggml_cgraph *pgVar29;
  size_type sVar30;
  reference ppgVar31;
  reference ppgVar32;
  ulong uVar33;
  llama_model *in_RSI;
  long *in_RDI;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint32_t in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  llama_rope_scaling_type in_stack_00000020;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  undefined4 in_stack_00000034;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  undefined4 in_stack_00000040;
  uint32_t in_stack_00000044;
  undefined4 in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  ggml_type in_stack_00000060;
  ggml_type in_stack_00000064;
  byte in_stack_00000068;
  byte in_stack_00000069;
  byte in_stack_0000006a;
  byte in_stack_0000006b;
  byte in_stack_0000006c;
  size_t size;
  ggml_backend_buffer_type_t buft_1;
  ggml_backend_t backend_5;
  size_t i_1;
  ggml_cgraph *gf_2;
  llama_ubatch ubatch_pp_1;
  ggml_cgraph *gf_1;
  llama_ubatch ubatch_tg;
  ggml_cgraph *gf;
  llama_ubatch ubatch_pp;
  int n_nodes_tg;
  int n_splits_tg;
  int n_nodes_pp;
  int n_splits_pp;
  int32_t n_outputs_save;
  llama_token token;
  uint32_t n_tokens;
  uint32_t n_seqs;
  ggml_backend_dev_props props;
  ggml_backend_device *dev_4;
  ggml_backend_dev_type dev_type;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_4;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *__range3;
  bool pipeline_parallel;
  size_t max_nodes;
  ggml_backend_buffer_type *host_buft;
  ggml_backend_device *dev_3;
  ggml_backend_dev_type backend_type;
  ggml_backend_buffer_type *buft;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_3;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *__range2_2;
  size_t memory_size_v;
  size_t memory_size_k;
  ggml_type type_v;
  ggml_type type_k;
  uint32_t kv_size;
  ggml_backend_set_n_threads_t ggml_backend_set_n_threads_fn;
  ggml_backend_reg_t reg;
  ggml_backend_dev_t dev_2;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *__range2_1;
  ggml_backend_t backend_1;
  ggml_backend_dev_t dev_1;
  size_t i;
  ggml_backend_t backend;
  ggml_backend_device *dev;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *__range2;
  uint32_t n_ctx_per_seq;
  llama_rope_scaling_type rope_scaling_type;
  llama_hparams *hparams;
  uint in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  llama_context *in_stack_fffffffffffff990;
  ggml_backend **in_stack_fffffffffffff998;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
  *in_stack_fffffffffffff9a0;
  size_type in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  undefined4 in_stack_fffffffffffff9e0;
  uint uVar36;
  undefined4 in_stack_fffffffffffff9e4;
  uint uVar37;
  llama_model *in_stack_fffffffffffffa30;
  undefined8 in_stack_fffffffffffffa40;
  llama_context *in_stack_fffffffffffffa48;
  llm_graph_type gtype;
  undefined4 in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa54;
  ggml_cgraph *in_stack_fffffffffffffa58;
  undefined6 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa66;
  byte in_stack_fffffffffffffa67;
  llama_context *in_stack_fffffffffffffa68;
  float local_53c;
  float local_524;
  float local_50c;
  long local_460;
  uint *local_3d8;
  uint local_3c4;
  undefined4 local_3b0;
  uint32_t local_3ac;
  uint32_t local_3a8;
  float local_3a4;
  float local_3a0;
  uint32_t local_39c;
  size_type local_2f0;
  undefined1 local_1d8 [36];
  byte local_1b4;
  byte local_1b1;
  llama_context *local_1b0;
  int local_1a4;
  reference local_1a0;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *local_198;
  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  local_190;
  long *local_188;
  byte local_179;
  long local_178;
  pointer local_170;
  long local_168;
  value_type local_160;
  int local_154;
  long local_150;
  reference local_148;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *local_140;
  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  local_138;
  long *local_130;
  size_t local_128;
  size_t local_120;
  uint local_118;
  ggml_type local_114;
  ggml_type local_110;
  uint local_10c;
  pointer local_108;
  long local_100;
  long local_f8;
  long local_f0;
  reference local_e8;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *local_e0;
  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  local_d8;
  long *local_d0;
  undefined1 local_c1;
  string local_c0 [32];
  long local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined1 local_81;
  string local_80 [32];
  long local_60;
  ggml_backend_device *local_58;
  ggml_backend_device **local_50;
  __normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
  local_48;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *local_40;
  uint local_34;
  llama_rope_scaling_type local_30;
  uint local_2c;
  llama_hparams *local_28;
  llama_model *local_10;
  
  *in_RDI = (long)in_RSI;
  local_10 = in_RSI;
  llama_adapter_cvec::llama_adapter_cvec((llama_adapter_cvec *)in_stack_fffffffffffff990);
  std::
  unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
  ::unordered_map((unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
                   *)0x3d645f);
  llama_sbatch::llama_sbatch((llama_sbatch *)in_stack_fffffffffffff990);
  llama_cross::llama_cross((llama_cross *)in_stack_fffffffffffff990);
  std::unique_ptr<llama_kv_cache_unified,std::default_delete<llama_kv_cache_unified>>::
  unique_ptr<std::default_delete<llama_kv_cache_unified>,void>
            ((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
             in_stack_fffffffffffff990);
  *(undefined1 *)(in_RDI + 0x45) = 0;
  in_RDI[0x46] = 0;
  in_RDI[0x47] = 0;
  in_RDI[0x48] = 0;
  in_RDI[0x49] = 0;
  std::
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
         *)0x3d6502);
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)((long)in_RDI + 0x284) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3d6532);
  std::unique_ptr<ggml_backend_sched,ggml_backend_sched_deleter>::
  unique_ptr<ggml_backend_sched_deleter,void>
            ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)in_stack_fffffffffffff990
            );
  in_RDI[0x55] = 0;
  std::
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  ::vector((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
            *)0x3d6575);
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_fffffffffffff990);
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  in_RDI[0x5c] = 0;
  in_RDI[0x5d] = 0;
  std::
  vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
  ::vector((vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
            *)0x3d65d9);
  std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::vector
            ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x3d65f5);
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::vector
            ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
             0x3d6611);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3d662d);
  std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>::
  unique_ptr<ggml_backend_buffer_deleter,void>
            ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
             in_stack_fffffffffffff990);
  *(undefined1 *)(in_RDI + 0x6b) = 0;
  in_RDI[0x6c] = 0;
  in_RDI[0x6d] = 0;
  in_RDI[0x6e] = 0;
  in_RDI[0x6f] = 0;
  in_RDI[0x70] = 0;
  in_RDI[0x71] = 0;
  *(undefined4 *)(in_RDI + 0x72) = 0;
  *(undefined4 *)((long)in_RDI + 0x394) = 0;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: constructing llama_context\n","llama_context");
  in_RDI[0x6c] = local_10->t_start_us;
  in_RDI[0x6d] = local_10->t_load_us;
  local_28 = &local_10->hparams;
  local_2c = 1;
  puVar14 = std::max<unsigned_int>(&local_2c,&stack0x00000014);
  *(uint *)((long)in_RDI + 0x14) = *puVar14;
  *(undefined4 *)(in_RDI + 3) = in_stack_00000018;
  *(undefined4 *)((long)in_RDI + 0x1c) = in_stack_0000001c;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_stack_00000034;
  *(undefined4 *)(in_RDI + 6) = in_stack_00000038;
  *(undefined4 *)((long)in_RDI + 0x34) = in_stack_0000003c;
  *(undefined4 *)(in_RDI + 7) = in_stack_00000040;
  *(undefined4 *)((long)in_RDI + 0x3c) = in_stack_00000048;
  *(byte *)(in_RDI + 8) = in_stack_00000069 & 1;
  *(byte *)((long)in_RDI + 0x42) = in_stack_0000006a & 1;
  *(byte *)((long)in_RDI + 0x43) = in_stack_0000006b & 1;
  *(byte *)((long)in_RDI + 0x44) = in_stack_0000006c & 1;
  *(undefined4 *)(in_RDI + 9) = in_stack_00000024;
  *(undefined1 *)((long)in_RDI + 0x45) = 0;
  if (in_stack_00000008 == 0) {
    local_39c = local_28->n_ctx_train;
  }
  else {
    local_39c = in_stack_00000008;
  }
  *(uint32_t *)(in_RDI + 1) = local_39c;
  if ((in_stack_0000002c != 0.0) || (NAN(in_stack_0000002c))) {
    local_3a0 = in_stack_0000002c;
  }
  else {
    local_3a0 = local_28->rope_freq_base_train;
  }
  *(float *)(in_RDI + 4) = local_3a0;
  if ((in_stack_00000030 != 0.0) || (NAN(in_stack_00000030))) {
    local_3a4 = in_stack_00000030;
  }
  else {
    local_3a4 = local_28->rope_freq_scale_train;
  }
  *(float *)((long)in_RDI + 0x24) = local_3a4;
  if (in_stack_00000044 == 0) {
    if (local_28->n_ctx_orig_yarn == 0) {
      local_3ac = local_28->n_ctx_train;
    }
    else {
      local_3ac = local_28->n_ctx_orig_yarn;
    }
    local_3a8 = local_3ac;
  }
  else {
    local_3a8 = in_stack_00000044;
  }
  *(uint32_t *)(in_RDI + 5) = local_3a8;
  in_RDI[10] = in_stack_00000050;
  in_RDI[0xb] = in_stack_00000058;
  local_30 = in_stack_00000020;
  if (in_stack_00000020 == LLAMA_ROPE_SCALING_TYPE_UNSPECIFIED) {
    local_30 = local_28->rope_scaling_type_train;
  }
  if (local_30 == LLAMA_ROPE_SCALING_TYPE_NONE) {
    *(undefined4 *)((long)in_RDI + 0x24) = 0x3f800000;
  }
  if (*(float *)((long)in_RDI + 0x2c) <= 0.0 && *(float *)((long)in_RDI + 0x2c) != 0.0) {
    local_3b0 = 0x3f800000;
    if (local_30 != LLAMA_ROPE_SCALING_TYPE_YARN) {
      local_3b0 = 0;
    }
    *(undefined4 *)((long)in_RDI + 0x2c) = local_3b0;
  }
  *(float *)(in_RDI + 6) = local_28->rope_attn_factor * *(float *)(in_RDI + 6);
  if ((int)in_RDI[9] == -1) {
    if (local_28->pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
      *(undefined4 *)(in_RDI + 9) = 0;
    }
    else {
      *(llama_pooling_type *)(in_RDI + 9) = local_28->pooling_type;
    }
  }
  if (in_stack_00000028 == -1) {
    *(byte *)((long)in_RDI + 0x41) = local_28->causal_attn & 1;
  }
  else {
    *(bool *)((long)in_RDI + 0x41) = in_stack_00000028 == 0;
  }
  if ((*(byte *)((long)in_RDI + 0x41) & 1) == 0) {
    local_3c4 = in_stack_0000000c;
  }
  else {
    puVar14 = std::min<unsigned_int>((uint *)(in_RDI + 1),&stack0x0000000c);
    local_3c4 = *puVar14;
  }
  *(uint *)((long)in_RDI + 0xc) = local_3c4;
  if (*(uint *)((long)in_RDI + 0xc) < 0x40) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_batch is less than GGML_KQ_MASK_PAD - increasing to %d\n",
                       "llama_context",0x40);
    *(undefined4 *)((long)in_RDI + 0xc) = 0x40;
  }
  if (in_stack_00000010 == 0) {
    local_3d8 = &stack0x0000000c;
  }
  else {
    local_3d8 = &stack0x00000010;
  }
  puVar14 = std::min<unsigned_int>((uint *)((long)in_RDI + 0xc),local_3d8);
  *(uint *)(in_RDI + 2) = *puVar14;
  local_34 = *(uint *)(in_RDI + 1) / *(uint *)((long)in_RDI + 0x14);
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_seq_max     = %u\n","llama_context",
                     (ulong)*(uint *)((long)in_RDI + 0x14));
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx         = %u\n","llama_context",
                     (ulong)*(uint *)(in_RDI + 1));
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ctx_per_seq = %u\n","llama_context",(ulong)local_34)
  ;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_batch       = %u\n","llama_context",
                     (ulong)*(uint *)((long)in_RDI + 0xc));
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_ubatch      = %u\n","llama_context",
                     (ulong)*(uint *)(in_RDI + 2));
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: causal_attn   = %d\n","llama_context",
                     (ulong)(*(byte *)((long)in_RDI + 0x41) & 1));
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: flash_attn    = %d\n","llama_context",
                     (ulong)(*(byte *)((long)in_RDI + 0x43) & 1));
  llama_log_internal((ggml_log_level)(double)*(float *)(in_RDI + 4),(char *)0x2,
                     "%s: freq_base     = %.1f\n","llama_context");
  llama_log_internal((ggml_log_level)(double)*(float *)((long)in_RDI + 0x24),(char *)0x2,
                     "%s: freq_scale    = %g\n","llama_context");
  if (local_34 < local_28->n_ctx_train) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_ctx_per_seq (%u) < n_ctx_train (%u) -- the full capacity of the model will not be utilized\n"
                       ,"llama_context",(ulong)local_34,(ulong)local_28->n_ctx_train);
  }
  if (local_28->n_ctx_train < local_34) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: n_ctx_pre_seq (%u) > n_ctx_train (%u) -- possible training context overflow\n"
                       ,"llama_context",(ulong)local_34,(ulong)local_28->n_ctx_train);
  }
  *(byte *)(in_RDI + 0x45) = in_stack_00000068 & 1;
  if ((local_28->vocab_only & 1U) == 0) {
    local_40 = &local_10->devices;
    local_48._M_current =
         (ggml_backend_device **)
         std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::begin
                   ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    local_50 = (ggml_backend_device **)
               std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::end
                         ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                               *)in_stack_fffffffffffff990,
                              (__normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988)),
          bVar3) {
      ppgVar15 = __gnu_cxx::
                 __normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                 ::operator*(&local_48);
      local_58 = *ppgVar15;
      local_60 = ggml_backend_dev_init(local_58,0);
      if (local_60 == 0) {
        local_81 = 1;
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar18 = ggml_backend_dev_name(local_58);
        format_abi_cxx11_((char *)local_80,"failed to initialize %s backend",uVar18);
        std::runtime_error::runtime_error(prVar17,local_80);
        local_81 = 0;
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
      ::emplace_back<ggml_backend*&>
                ((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                  *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      __gnu_cxx::
      __normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
      ::operator++(&local_48);
    }
    for (local_90 = 0; uVar33 = local_90, uVar16 = ggml_backend_dev_count(), uVar33 < uVar16;
        local_90 = local_90 + 1) {
      local_98 = ggml_backend_dev_get(local_90);
      iVar5 = ggml_backend_dev_type();
      if (iVar5 == 2) {
        local_a0 = ggml_backend_dev_init(local_98,0);
        if (local_a0 == 0) {
          local_c1 = 1;
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          uVar18 = ggml_backend_dev_name(local_98);
          format_abi_cxx11_((char *)local_c0,"failed to initialize %s backend",uVar18);
          std::runtime_error::runtime_error(prVar17,local_c0);
          local_c1 = 0;
          __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
        ::emplace_back<ggml_backend*&>
                  ((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                    *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      }
    }
    lVar19 = ggml_backend_init_by_type(0,0);
    in_RDI[0x55] = lVar19;
    if (in_RDI[0x55] == 0) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"failed to initialize CPU backend");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<std::unique_ptr<ggml_backend,ggml_backend_deleter>,std::allocator<std::unique_ptr<ggml_backend,ggml_backend_deleter>>>
    ::emplace_back<ggml_backend*&>
              ((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    local_d0 = in_RDI + 0x56;
    local_d8._M_current =
         (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
         std::
         vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
         ::begin((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                  *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    local_e0 = (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
               std::
               vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
               ::end((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                      *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                          *)in_stack_fffffffffffff990,
                         (__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      iVar9 = (int32_t)((ulong)in_stack_fffffffffffffa40 >> 0x20);
      if (!bVar3) break;
      local_e8 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                 ::operator*(&local_d8);
      pgVar25 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                          ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                           in_stack_fffffffffffff990);
      local_f0 = ggml_backend_get_device(pgVar25);
      if (local_f0 == 0) {
        local_460 = 0;
      }
      else {
        local_460 = ggml_backend_dev_backend_reg(local_f0);
      }
      local_f8 = local_460;
      if ((local_460 != 0) &&
         (local_100 = ggml_backend_reg_get_proc_address(local_460,"ggml_backend_set_n_threads"),
         local_100 != 0)) {
        local_108 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                              ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                               in_stack_fffffffffffff990);
        std::
        vector<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>,std::allocator<std::pair<ggml_backend*,void(*)(ggml_backend*,int)>>>
        ::emplace_back<ggml_backend*,void(*&)(ggml_backend*,int)>
                  ((vector<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>,_std::allocator<std::pair<ggml_backend_*,_void_(*)(ggml_backend_*,_int)>_>_>
                    *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                   (_func_void_ggml_backend_ptr_int **)in_stack_fffffffffffff990);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
      ::operator++(&local_d8);
    }
    llama_set_abort_callback
              (in_stack_fffffffffffff990,
               (_func_bool_void_ptr *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
               (void *)0x3d7456);
    uVar6 = output_reserve(in_stack_fffffffffffffa48,iVar9);
    if (uVar6 < in_stack_00000014) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"failed to reserve initial output buffer");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar20 = std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::get
                        ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
                         in_stack_fffffffffffff990);
    uVar18 = ggml_backend_buffer_name(pgVar20);
    pgVar20 = std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::get
                        ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)
                         in_stack_fffffffffffff990);
    uVar21 = ggml_backend_buffer_get_size(pgVar20);
    auVar34._8_4_ = (int)((ulong)uVar21 >> 0x20);
    auVar34._0_8_ = uVar21;
    auVar34._12_4_ = 0x45300000;
    llama_log_internal((ggml_log_level)
                       (((auVar34._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0)) *
                        0.0009765625 * 0.0009765625),(char *)0x2,
                       "%s: %10s  output buffer size = %8.2f MiB\n","llama_context",uVar18);
  }
  if ((local_28->vocab_only & 1U) == 0) {
    llama_model::create_memory(in_stack_fffffffffffffa30);
    std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::reset
              ((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
               in_stack_fffffffffffff990,
               (pointer)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: n_ctx = %u\n","llama_context",
                       (ulong)*(uint *)(in_RDI + 1));
    lVar19 = in_RDI[1];
    plVar22 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3d7651);
    uVar7 = llama_kv_cache_unified::get_padding(plVar22,(llama_cparams *)(in_RDI + 1));
    plVar22 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3d769b);
    uVar8 = llama_kv_cache_unified::get_padding(plVar22,(llama_cparams *)(in_RDI + 1));
    *(uint32_t *)(in_RDI + 1) = (int)lVar19 + -1 + uVar7 & -uVar8;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: n_ctx = %u (padded)\n","llama_context",
                       (ulong)*(uint *)(in_RDI + 1));
    local_10c = *(uint *)(in_RDI + 1);
    local_110 = in_stack_00000060;
    local_114 = in_stack_00000064;
    bVar3 = llama_model_is_recurrent(local_10);
    if (bVar3) {
      local_118 = 1;
      puVar14 = std::max<unsigned_int>(&local_118,&stack0x00000014);
      local_10c = *puVar14;
      local_110 = GGML_TYPE_F32;
      local_114 = GGML_TYPE_F32;
    }
    uVar6 = local_28->n_embd_head_k;
    lVar19 = ggml_blck_size(local_110);
    if ((long)(ulong)uVar6 % lVar19 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0xca,"GGML_ASSERT(%s) failed",
                 "hparams.n_embd_head_k % ggml_blck_size(type_k) == 0");
    }
    uVar6 = local_28->n_embd_head_v;
    lVar19 = ggml_blck_size(local_114);
    if ((long)(ulong)uVar6 % lVar19 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0xcb,"GGML_ASSERT(%s) failed",
                 "hparams.n_embd_head_v % ggml_blck_size(type_v) == 0");
    }
    plVar22 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3d787c);
    in_stack_fffffffffffff988 = *(byte *)((long)in_RDI + 0x42) & 1;
    uVar6 = llama_kv_cache_unified::init
                      (plVar22,local_10,(llama_cparams *)(in_RDI + 1),local_110,local_114,local_10c,
                       SUB41(in_stack_fffffffffffff988,0));
    if ((uVar6 & 1) == 0) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"failed to initialize self-attention cache");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
    operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
               0x3d7957);
    local_120 = llama_kv_cache_unified::size_k_bytes
                          ((llama_kv_cache_unified *)
                           CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
    operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
               0x3d798d);
    local_128 = llama_kv_cache_unified::size_v_bytes
                          ((llama_kv_cache_unified *)
                           CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0));
    local_50c = (float)(local_120 + local_128);
    uVar18 = ggml_type_name(local_110);
    local_524 = (float)local_120;
    uVar21 = ggml_type_name(local_114);
    local_53c = (float)local_128;
    llama_log_internal((ggml_log_level)(double)(local_50c * 9.536743e-07),
                       (char *)(double)(local_524 * 9.536743e-07),(double)(local_53c * 9.536743e-07)
                       ,2,"%s: KV self size  = %7.2f MiB, K (%s): %7.2f MiB, V (%s): %7.2f MiB\n",
                       "llama_context",uVar18,uVar21);
  }
  gtype = (llm_graph_type)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  if ((local_28->vocab_only & 1U) == 0) {
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: enumerating backends\n","llama_context");
    std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::clear
              ((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
               0x3d7bab);
    std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::clear
              ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x3d7bbf);
    local_130 = in_RDI + 0x56;
    local_138._M_current =
         (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
         std::
         vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
         ::begin((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                  *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    local_140 = (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                std::
                vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                ::end((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                       *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                               *)in_stack_fffffffffffff990,
                              (__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988)),
          bVar3) {
      local_148 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                  ::operator*(&local_138);
      pgVar25 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                          ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                           in_stack_fffffffffffff990);
      local_150 = ggml_backend_get_default_buffer_type(pgVar25);
      pgVar25 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                          ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                           in_stack_fffffffffffff990);
      uVar18 = ggml_backend_get_device(pgVar25);
      local_154 = ggml_backend_dev_type(uVar18);
      if ((local_154 == 0) &&
         (bVar3 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::empty
                            ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                              *)in_stack_fffffffffffff9a0), !bVar3)) {
        ppgVar23 = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::
                   operator[](&local_10->devices,0);
        local_160 = *ppgVar23;
        local_168 = ggml_backend_dev_host_buffer_type(local_160);
        if (local_168 != 0) {
          local_150 = local_168;
        }
      }
      std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::
      push_back(in_stack_fffffffffffff9a0,(value_type *)in_stack_fffffffffffff998);
      local_170 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                            ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                             in_stack_fffffffffffff990);
      std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::push_back
                ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                 in_stack_fffffffffffff990,
                 (value_type *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
      ::operator++(&local_138);
    }
    sVar24 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                       ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)(in_RDI + 0x61));
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: backend_ptrs.size() = %zu\n","llama_context",sVar24
                      );
    iVar9 = graph_max_nodes(in_stack_fffffffffffff990);
    local_178 = (long)iVar9;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: max_nodes = %zu\n","llama_context",local_178);
    ggml_tensor_overhead();
    ggml_graph_overhead_custom(local_178,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8);
    in_stack_fffffffffffffa68 = (llama_context *)llama_model::n_devices((llama_model *)0x3d7ea0);
    in_stack_fffffffffffffa67 = 0;
    if (((((llama_context *)0x1 < in_stack_fffffffffffffa68) &&
         (in_stack_fffffffffffffa67 = 0,
         (int)(local_10->hparams).n_layer < (local_10->params).n_gpu_layers)) &&
        (in_stack_fffffffffffffa67 = 0, (local_10->params).split_mode == LLAMA_SPLIT_MODE_LAYER)) &&
       (in_stack_fffffffffffffa67 = 0, (*(byte *)((long)in_RDI + 0x42) & 1) != 0)) {
      in_stack_fffffffffffffa66 = llama_model::has_tensor_overrides((llama_model *)0x3d7f23);
      in_stack_fffffffffffffa67 = in_stack_fffffffffffffa66 ^ 0xff;
    }
    gtype = (llm_graph_type)((ulong)in_stack_fffffffffffffa48 >> 0x20);
    local_179 = in_stack_fffffffffffffa67 & 1;
    if (local_179 != 0) {
      local_188 = in_RDI + 0x56;
      local_190._M_current =
           (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
           std::
           vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
           ::begin((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                    *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      local_198 = (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                  std::
                  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                  ::end((vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                         *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                            *)in_stack_fffffffffffff990,
                           (__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
        gtype = (llm_graph_type)((ulong)in_stack_fffffffffffffa48 >> 0x20);
        if (!bVar3) break;
        local_1a0 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                    ::operator*(&local_190);
        pgVar25 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                            ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                             in_stack_fffffffffffff990);
        in_stack_fffffffffffffa58 = (ggml_cgraph *)ggml_backend_get_device(pgVar25);
        in_stack_fffffffffffffa54 = ggml_backend_dev_type(in_stack_fffffffffffffa58);
        local_1a4 = in_stack_fffffffffffffa54;
        if (in_stack_fffffffffffffa54 != 0) {
          pgVar25 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                              ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)
                               in_stack_fffffffffffff990);
          in_stack_fffffffffffffa48 = (llama_context *)ggml_backend_get_device(pgVar25);
          local_1b0 = in_stack_fffffffffffffa48;
          ggml_backend_dev_get_props(in_stack_fffffffffffffa48,local_1d8);
          gtype = (llm_graph_type)((ulong)in_stack_fffffffffffffa48 >> 0x20);
          if (((local_1b4 & 1) == 0) || ((local_1b1 & 1) == 0)) {
            local_179 = 0;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
        ::operator++(&local_190);
      }
    }
    ppgVar26 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::data
                         ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x3d80c3);
    ppgVar27 = std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
               ::data((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                       *)0x3d80df);
    sVar24 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                       ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)(in_RDI + 0x61));
    ggml_backend_sched_new(ppgVar26,ppgVar27,sVar24 & 0xffffffff,local_178,local_179 & 1);
    std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::reset
              ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
               in_stack_fffffffffffff990,
               (pointer)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    if ((local_179 & 1) != 0) {
      pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                          ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                           in_stack_fffffffffffff990);
      uVar6 = ggml_backend_sched_get_n_copies(pgVar28);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: pipeline parallelism enabled (n_copies=%d)\n",
                         "llama_context",(ulong)uVar6);
    }
  }
  if ((local_28->vocab_only & 1U) == 0) {
    puVar14 = std::min<unsigned_int>((uint *)(in_RDI + 1),(uint *)(in_RDI + 2));
    uVar6 = *puVar14;
    llama_vocab::token_bos((llama_vocab *)0x3d81f8);
    lVar19 = in_RDI[0x50];
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                       "%s: worst-case: n_tokens = %d, n_seqs = %d, n_outputs = %d\n",
                       "llama_context",(ulong)uVar6,1,(ulong)*(uint *)(in_RDI + 0x50));
    plVar22 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3d8297);
    uVar7 = plVar22->size;
    plVar22 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                            *)0x3d82ab);
    plVar22->n = uVar7;
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x3d82c9);
    *(uint *)(in_RDI + 0x50) = uVar6;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",(ulong)uVar6,1);
    pgVar29 = graph_init((llama_context *)
                         CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
    std::unique_ptr<ggml_context,_ggml_context_deleter>::get
              ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_fffffffffffff990);
    graph_build(in_stack_fffffffffffffa68,
                (ggml_context *)
                CONCAT17(in_stack_fffffffffffffa67,
                         CONCAT16(in_stack_fffffffffffffa66,in_stack_fffffffffffffa60)),
                in_stack_fffffffffffffa58,
                (llama_ubatch *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),gtype)
    ;
    std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
              ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
               in_stack_fffffffffffff9a0);
    pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                        ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                         in_stack_fffffffffffff990);
    bVar4 = ggml_backend_sched_reserve(pgVar28,pgVar29);
    if ((bVar4 & 1) == 0) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"failed to allocate compute pp buffers");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                        ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                         in_stack_fffffffffffff990);
    uVar10 = ggml_backend_sched_get_n_splits(pgVar28);
    uVar37 = uVar10;
    uVar11 = ggml_graph_n_nodes(pgVar29);
    *(undefined4 *)(in_RDI + 0x50) = 1;
    uVar36 = uVar11;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",1,1);
    pgVar29 = graph_init((llama_context *)CONCAT44(uVar37,uVar36));
    std::unique_ptr<ggml_context,_ggml_context_deleter>::get
              ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_fffffffffffff990);
    graph_build(in_stack_fffffffffffffa68,
                (ggml_context *)
                CONCAT17(in_stack_fffffffffffffa67,
                         CONCAT16(in_stack_fffffffffffffa66,in_stack_fffffffffffffa60)),
                in_stack_fffffffffffffa58,
                (llama_ubatch *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),gtype)
    ;
    std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
              ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
               in_stack_fffffffffffff9a0);
    pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                        ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                         in_stack_fffffffffffff990);
    bVar4 = ggml_backend_sched_reserve(pgVar28,pgVar29);
    if ((bVar4 & 1) == 0) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"failed to allocate compute tg buffers");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                        ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                         in_stack_fffffffffffff990);
    uVar12 = ggml_backend_sched_get_n_splits(pgVar28);
    uVar13 = ggml_graph_n_nodes(pgVar29);
    *(uint *)(in_RDI + 0x50) = uVar6;
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving graph for n_tokens = %d, n_seqs = %d\n",
                       "llama_context",(ulong)uVar6,1);
    pgVar29 = graph_init((llama_context *)CONCAT44(uVar37,uVar36));
    std::unique_ptr<ggml_context,_ggml_context_deleter>::get
              ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_fffffffffffff990);
    graph_build(in_stack_fffffffffffffa68,
                (ggml_context *)
                CONCAT17(in_stack_fffffffffffffa67,
                         CONCAT16(in_stack_fffffffffffffa66,in_stack_fffffffffffffa60)),
                in_stack_fffffffffffffa58,
                (llama_ubatch *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),gtype)
    ;
    std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
              ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
               in_stack_fffffffffffff9a0);
    pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                        ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                         in_stack_fffffffffffff990);
    bVar4 = ggml_backend_sched_reserve(pgVar28,pgVar29);
    if ((bVar4 & 1) == 0) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"failed to allocate compute pp buffers");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(int *)(in_RDI + 0x50) = (int)lVar19;
    local_2f0 = 0;
    while (sVar24 = local_2f0,
          sVar30 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                             ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                              (in_RDI + 0x61)), sVar24 < sVar30) {
      ppgVar31 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::operator[]
                           ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                            (in_RDI + 0x61),local_2f0);
      pgVar1 = *ppgVar31;
      ppgVar32 = std::
                 vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::
                 operator[]((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                             *)(in_RDI + 100),local_2f0);
      pgVar2 = *ppgVar32;
      pgVar28 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                          ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                           in_stack_fffffffffffff990);
      uVar33 = ggml_backend_sched_get_buffer_size(pgVar28,pgVar1);
      if (1 < uVar33) {
        in_stack_fffffffffffff990 = (llama_context *)ggml_backend_buft_name(pgVar2);
        auVar35._8_4_ = (int)(uVar33 >> 0x20);
        auVar35._0_8_ = uVar33;
        auVar35._12_4_ = 0x45300000;
        llama_log_internal((ggml_log_level)
                           (((auVar35._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar33) - 4503599627370496.0)) *
                            0.0009765625 * 0.0009765625),(char *)0x2,
                           "%s: %10s compute buffer size = %8.2f MiB\n","llama_context",
                           in_stack_fffffffffffff990);
      }
      local_2f0 = local_2f0 + 1;
    }
    if (uVar11 == uVar13) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph nodes  = %d\n","llama_context",(ulong)uVar11
                        );
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph nodes  = %d (with bs=%d), %d (with bs=1)\n",
                         "llama_context",(ulong)uVar11,(ulong)uVar6,(ulong)uVar13);
    }
    if (uVar10 == uVar12) {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph splits = %d\n","llama_context",(ulong)uVar10
                        );
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: graph splits = %d (with bs=%d), %d (with bs=1)\n",
                         "llama_context",(ulong)uVar10,(ulong)uVar6,(ulong)uVar12);
    }
  }
  return;
}

Assistant:

llama_context::llama_context(
        const llama_model & model,
              llama_context_params params) :
    model(model) {
    LLAMA_LOG_INFO("%s: constructing llama_context\n", __func__);

    t_start_us = model.t_start_us;
    t_load_us  = model.t_load_us;

    const auto & hparams = model.hparams;

    cparams.n_seq_max        = std::max(1u, params.n_seq_max);
    cparams.n_threads        = params.n_threads;
    cparams.n_threads_batch  = params.n_threads_batch;
    cparams.yarn_ext_factor  = params.yarn_ext_factor;
    cparams.yarn_attn_factor = params.yarn_attn_factor;
    cparams.yarn_beta_fast   = params.yarn_beta_fast;
    cparams.yarn_beta_slow   = params.yarn_beta_slow;
    cparams.defrag_thold     = params.defrag_thold;
    cparams.embeddings       = params.embeddings;
    cparams.offload_kqv      = params.offload_kqv;
    cparams.flash_attn       = params.flash_attn;
    cparams.no_perf          = params.no_perf;
    cparams.pooling_type     = params.pooling_type;
    cparams.warmup           = false;

    cparams.n_ctx            = params.n_ctx           == 0    ? hparams.n_ctx_train           : params.n_ctx;
    cparams.rope_freq_base   = params.rope_freq_base  == 0.0f ? hparams.rope_freq_base_train  : params.rope_freq_base;
    cparams.rope_freq_scale  = params.rope_freq_scale == 0.0f ? hparams.rope_freq_scale_train : params.rope_freq_scale;

    cparams.n_ctx_orig_yarn  = params.yarn_orig_ctx    != 0 ? params.yarn_orig_ctx    :
                               hparams.n_ctx_orig_yarn != 0 ? hparams.n_ctx_orig_yarn :
                                                              hparams.n_ctx_train;

    cparams.cb_eval           = params.cb_eval;
    cparams.cb_eval_user_data = params.cb_eval_user_data;

    auto rope_scaling_type = params.rope_scaling_type;
    if (rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_UNSPECIFIED) {
        rope_scaling_type = hparams.rope_scaling_type_train;
    }

    if (rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_NONE) {
        cparams.rope_freq_scale = 1.0f; // never scale if scaling type is none
    }

    if (cparams.yarn_ext_factor < 0.0f) { // negative indicates 'not set'
        cparams.yarn_ext_factor = rope_scaling_type == LLAMA_ROPE_SCALING_TYPE_YARN ? 1.0f : 0.0f;
    }

    cparams.yarn_attn_factor *= hparams.rope_attn_factor;

    if (cparams.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
        if (hparams.pooling_type == LLAMA_POOLING_TYPE_UNSPECIFIED) {
            cparams.pooling_type = LLAMA_POOLING_TYPE_NONE;
        } else {
            cparams.pooling_type = hparams.pooling_type;
        }
    }

    if (params.attention_type == LLAMA_ATTENTION_TYPE_UNSPECIFIED) {
        cparams.causal_attn = hparams.causal_attn;
    } else {
        cparams.causal_attn = params.attention_type == LLAMA_ATTENTION_TYPE_CAUSAL;
    }

    // with causal attention, the batch size is limited by the context size
    cparams.n_batch = cparams.causal_attn ? std::min(cparams.n_ctx, params.n_batch) : params.n_batch;

    // the batch has to be at least GGML_KQ_MASK_PAD because we will be padding the KQ_mask
    // this is required by GPU kernels in order to avoid out-of-bounds accesses (e.g. ggml_flash_attn_ext)
    // ref: https://github.com/ggerganov/llama.cpp/pull/5021
    // TODO: this padding is not needed for the cache-less context so we should probably move it to llama_context_kv_self
    if (cparams.n_batch < GGML_KQ_MASK_PAD) {
        LLAMA_LOG_WARN("%s: n_batch is less than GGML_KQ_MASK_PAD - increasing to %d\n", __func__, GGML_KQ_MASK_PAD);
        cparams.n_batch = GGML_KQ_MASK_PAD;
    }

    cparams.n_ubatch = std::min(cparams.n_batch, params.n_ubatch == 0 ? params.n_batch : params.n_ubatch);

    const uint32_t n_ctx_per_seq = cparams.n_ctx / cparams.n_seq_max;

    LLAMA_LOG_INFO("%s: n_seq_max     = %u\n",   __func__, cparams.n_seq_max);
    LLAMA_LOG_INFO("%s: n_ctx         = %u\n",   __func__, cparams.n_ctx);
    LLAMA_LOG_INFO("%s: n_ctx_per_seq = %u\n",   __func__, n_ctx_per_seq);
    LLAMA_LOG_INFO("%s: n_batch       = %u\n",   __func__, cparams.n_batch);
    LLAMA_LOG_INFO("%s: n_ubatch      = %u\n",   __func__, cparams.n_ubatch);
    LLAMA_LOG_INFO("%s: causal_attn   = %d\n",   __func__, cparams.causal_attn);
    LLAMA_LOG_INFO("%s: flash_attn    = %d\n",   __func__, cparams.flash_attn);
    LLAMA_LOG_INFO("%s: freq_base     = %.1f\n", __func__, cparams.rope_freq_base);
    LLAMA_LOG_INFO("%s: freq_scale    = %g\n",   __func__, cparams.rope_freq_scale);

    if (n_ctx_per_seq < hparams.n_ctx_train) {
        LLAMA_LOG_WARN("%s: n_ctx_per_seq (%u) < n_ctx_train (%u) -- the full capacity of the model will not be utilized\n",
                __func__, n_ctx_per_seq, hparams.n_ctx_train);
    }

    if (n_ctx_per_seq > hparams.n_ctx_train) {
        LLAMA_LOG_WARN("%s: n_ctx_pre_seq (%u) > n_ctx_train (%u) -- possible training context overflow\n",
                __func__, n_ctx_per_seq, hparams.n_ctx_train);
    }

    logits_all = params.logits_all;

    if (!hparams.vocab_only) {
        // GPU backends
        for (auto * dev : model.devices) {
            ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
            if (backend == nullptr) {
                throw std::runtime_error(format("failed to initialize %s backend", ggml_backend_dev_name(dev)));
            }
            backends.emplace_back(backend);
        }

        // add ACCEL backends (such as BLAS)
        for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
            ggml_backend_dev_t dev = ggml_backend_dev_get(i);
            if (ggml_backend_dev_type(dev) == GGML_BACKEND_DEVICE_TYPE_ACCEL) {
                ggml_backend_t backend = ggml_backend_dev_init(dev, nullptr);
                if (backend == nullptr) {
                    throw std::runtime_error(format("failed to initialize %s backend", ggml_backend_dev_name(dev)));
                }
                backends.emplace_back(backend);
            }
        }

        // add CPU backend
        backend_cpu = ggml_backend_init_by_type(GGML_BACKEND_DEVICE_TYPE_CPU, nullptr);
        if (backend_cpu == nullptr) {
            throw std::runtime_error("failed to initialize CPU backend");
        }
        backends.emplace_back(backend_cpu);

        // create a list of the set_n_threads functions in the backends
        for (auto & backend : backends) {
            ggml_backend_dev_t dev = ggml_backend_get_device(backend.get());
            ggml_backend_reg_t reg = dev ? ggml_backend_dev_backend_reg(dev) : nullptr;
            if (reg) {
                auto ggml_backend_set_n_threads_fn = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
                if (ggml_backend_set_n_threads_fn) {
                    set_n_threads_fns.emplace_back(backend.get(), ggml_backend_set_n_threads_fn);
                }
            }
        }

        llama_set_abort_callback(this, params.abort_callback, params.abort_callback_data);

        // graph outputs buffer
        {
            // resized during inference when a batch uses more outputs
            if ((uint32_t) output_reserve(params.n_seq_max) < params.n_seq_max) {
                throw std::runtime_error("failed to reserve initial output buffer");
            }

            LLAMA_LOG_INFO("%s: %10s  output buffer size = %8.2f MiB\n", __func__,
                    ggml_backend_buffer_name    (buf_output.get()),
                    ggml_backend_buffer_get_size(buf_output.get()) / 1024.0 / 1024.0);
        }
    }

    // init the memory module
    // TODO: for now, always create a unified KV cache
    if (!hparams.vocab_only) {
        kv_self.reset(static_cast<llama_kv_cache_unified *>(model.create_memory()));

        LLAMA_LOG_DEBUG("%s: n_ctx = %u\n", __func__, cparams.n_ctx);

        cparams.n_ctx = GGML_PAD(cparams.n_ctx, kv_self->get_padding(cparams));

        LLAMA_LOG_DEBUG("%s: n_ctx = %u (padded)\n", __func__, cparams.n_ctx);

        uint32_t kv_size = cparams.n_ctx;
        ggml_type type_k = params.type_k;
        ggml_type type_v = params.type_v;

        if (llama_model_is_recurrent(&model)) {
            // Mamba needs at least as many KV cells as there are sequences kept at any time
            kv_size = std::max((uint32_t) 1, params.n_seq_max);
            // it's probably best to keep as much precision as possible for the states
            type_k = GGML_TYPE_F32; // required by ggml_ssm_conv for Mamba's conv_states
            type_v = GGML_TYPE_F32; // required by ggml_ssm_scan for Mamba's ssm_states
        }

        GGML_ASSERT(hparams.n_embd_head_k % ggml_blck_size(type_k) == 0);
        GGML_ASSERT(hparams.n_embd_head_v % ggml_blck_size(type_v) == 0);

        if (!kv_self->init(model, cparams, type_k, type_v, kv_size, cparams.offload_kqv)) {
            throw std::runtime_error("failed to initialize self-attention cache");
        }

        {
            const size_t memory_size_k = kv_self->size_k_bytes();
            const size_t memory_size_v = kv_self->size_v_bytes();

            LLAMA_LOG_INFO("%s: KV self size  = %7.2f MiB, K (%s): %7.2f MiB, V (%s): %7.2f MiB\n", __func__,
                    (float)(memory_size_k + memory_size_v) / (1024.0f * 1024.0f),
                    ggml_type_name(type_k), (float)memory_size_k / (1024.0f * 1024.0f),
                    ggml_type_name(type_v), (float)memory_size_v / (1024.0f * 1024.0f));
        }
    }

    // init backends
    if (!hparams.vocab_only) {
        LLAMA_LOG_DEBUG("%s: enumerating backends\n", __func__);

        backend_buft.clear();
        backend_ptrs.clear();

        for (auto & backend : backends) {
            auto * buft = ggml_backend_get_default_buffer_type(backend.get());
            auto backend_type = ggml_backend_dev_type(ggml_backend_get_device(backend.get()));

            if (backend_type == GGML_BACKEND_DEVICE_TYPE_CPU && !model.devices.empty()) {
                // use the host buffer of the first device CPU for faster transfer of the intermediate state
                auto * dev = model.devices[0];
                auto * host_buft = ggml_backend_dev_host_buffer_type(dev);
                if (host_buft) {
                    buft = host_buft;
                }
            }

            backend_buft.push_back(buft);
            backend_ptrs.push_back(backend.get());
        }

        LLAMA_LOG_DEBUG("%s: backend_ptrs.size() = %zu\n", __func__, backend_ptrs.size());

        const size_t max_nodes = this->graph_max_nodes();

        LLAMA_LOG_DEBUG("%s: max_nodes = %zu\n", __func__, max_nodes);

        // buffer used to store the computation graph and the tensor meta data
        buf_compute_meta.resize(ggml_tensor_overhead()*max_nodes + ggml_graph_overhead_custom(max_nodes, false));

        // TODO: move these checks to ggml_backend_sched
        // enabling pipeline parallelism in the scheduler increases memory usage, so it is only done when necessary
        bool pipeline_parallel =
            model.n_devices() > 1 &&
            model.params.n_gpu_layers > (int) model.hparams.n_layer &&
            model.params.split_mode == LLAMA_SPLIT_MODE_LAYER &&
            cparams.offload_kqv &&
            !model.has_tensor_overrides();

        // pipeline parallelism requires support for async compute and events in all devices
        if (pipeline_parallel) {
            for (auto & backend : backends) {
                auto dev_type = ggml_backend_dev_type(ggml_backend_get_device(backend.get()));
                if (dev_type == GGML_BACKEND_DEVICE_TYPE_CPU) {
                    // ignore CPU backend
                    continue;
                }
                auto * dev = ggml_backend_get_device(backend.get());
                ggml_backend_dev_props props;
                ggml_backend_dev_get_props(dev, &props);
                if (!props.caps.async || !props.caps.events) {
                    // device does not support async compute or events
                    pipeline_parallel = false;
                    break;
                }
            }
        }

        sched.reset(ggml_backend_sched_new(backend_ptrs.data(), backend_buft.data(), backend_ptrs.size(), max_nodes, pipeline_parallel));

        if (pipeline_parallel) {
            LLAMA_LOG_INFO("%s: pipeline parallelism enabled (n_copies=%d)\n", __func__, ggml_backend_sched_get_n_copies(sched.get()));
        }
    }

    // reserve worst-case graph
    if (!hparams.vocab_only) {
        const uint32_t n_seqs = 1; // TODO: worst-case number of sequences
        const uint32_t n_tokens = std::min(cparams.n_ctx, cparams.n_ubatch);

        llama_token token = model.vocab.token_bos(); // not actually used by llama_build_graph, but required to choose between token and embedding inputs graph

        // restore later
        // TODO: something cleaner
        const auto n_outputs_save = n_outputs;

        LLAMA_LOG_DEBUG("%s: worst-case: n_tokens = %d, n_seqs = %d, n_outputs = %d\n", __func__, n_tokens, n_seqs, n_outputs);

        int n_splits_pp = -1;
        int n_nodes_pp  = -1;

        int n_splits_tg = -1;
        int n_nodes_tg  = -1;

        // simulate full KV cache
        kv_self->n = kv_self->size;

        cross.v_embd.clear();

        // reserve pp graph first so that buffers are only allocated once
        {
            llama_ubatch ubatch_pp = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            // max number of outputs
            n_outputs = ubatch_pp.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_pp.n_tokens, ubatch_pp.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_pp, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute pp buffers");
            }

            n_splits_pp = ggml_backend_sched_get_n_splits(sched.get());
            n_nodes_pp  = ggml_graph_n_nodes(gf);
        }

        // reserve with tg graph to get the number of splits and nodes
        {
            llama_ubatch ubatch_tg = { true, 1, 1, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            n_outputs = ubatch_tg.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_tg.n_tokens, ubatch_tg.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_tg, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute tg buffers");
            }

            n_splits_tg = ggml_backend_sched_get_n_splits(sched.get());
            n_nodes_tg  = ggml_graph_n_nodes(gf);
        }

        // reserve again with pp graph to avoid ggml-alloc reallocations during inference
        {
            llama_ubatch ubatch_pp = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

            n_outputs = ubatch_pp.n_tokens;

            LLAMA_LOG_DEBUG("%s: reserving graph for n_tokens = %d, n_seqs = %d\n", __func__, ubatch_pp.n_tokens, ubatch_pp.n_seqs);

            auto * gf = graph_init();
            graph_build(ctx_compute.get(), gf, ubatch_pp, LLM_GRAPH_TYPE_DEFAULT);

            if (!ggml_backend_sched_reserve(sched.get(), gf)) {
                throw std::runtime_error("failed to allocate compute pp buffers");
            }
        }

        n_outputs = n_outputs_save;

        for (size_t i = 0; i < backend_ptrs.size(); ++i) {
            ggml_backend_t             backend = backend_ptrs[i];
            ggml_backend_buffer_type_t buft    = backend_buft[i];
            size_t size = ggml_backend_sched_get_buffer_size(sched.get(), backend);
            if (size > 1) {
                LLAMA_LOG_INFO("%s: %10s compute buffer size = %8.2f MiB\n", __func__,
                        ggml_backend_buft_name(buft),
                        size / 1024.0 / 1024.0);
            }
        }

        if (n_nodes_pp == n_nodes_tg) {
            LLAMA_LOG_INFO("%s: graph nodes  = %d\n", __func__, n_nodes_pp);
        } else {
            LLAMA_LOG_INFO("%s: graph nodes  = %d (with bs=%d), %d (with bs=1)\n", __func__, n_nodes_pp, n_tokens, n_nodes_tg);
        }

        if (n_splits_pp == n_splits_tg) {
            LLAMA_LOG_INFO("%s: graph splits = %d\n", __func__, n_splits_pp);
        } else {
            LLAMA_LOG_INFO("%s: graph splits = %d (with bs=%d), %d (with bs=1)\n", __func__, n_splits_pp, n_tokens, n_splits_tg);
        }
    }
}